

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::Read(ON_PolyCurve *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int segment_count;
  int reserved2;
  int reserved1;
  ON_Curve *crv;
  int minor_version;
  int major_version;
  ON_Object *obj;
  ON__INT32 local_84 [3];
  ON_Curve *local_78;
  ON_PolyCurve *local_70;
  int local_68 [2];
  ON_BoundingBox local_60;
  
  ON_CurveArray::Destroy(&this->m_segment);
  ON_SimpleArray<double>::SetCapacity(&this->m_t,0);
  local_68[1] = 0;
  local_68[0] = 0;
  bVar2 = ON_BinaryArchive::Read3dmChunkVersion(file,local_68 + 1,local_68);
  if (bVar2) {
    local_84[0] = 0;
    local_84[2] = 0;
    local_84[1] = 0;
    bVar2 = ON_BinaryArchive::ReadInt(file,local_84);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::ReadInt(file,local_84 + 2);
    }
    if (bVar2 != false) {
      bVar2 = ON_BinaryArchive::ReadInt(file,local_84 + 1);
    }
    local_70 = this;
    if (bVar2 != false) {
      ON_BoundingBox::ON_BoundingBox(&local_60);
      bVar2 = ON_BinaryArchive::ReadBoundingBox(file,&local_60);
    }
    if (bVar2 != false) {
      bVar2 = ON_BinaryArchive::ReadArray(file,&this->m_t);
    }
    if (bVar2 == true && 0 < local_84[0]) {
      iVar5 = 1;
      do {
        local_60.m_min.x = 0.0;
        local_78 = (ON_Curve *)0x0;
        iVar3 = ON_BinaryArchive::ReadObject(file,(ON_Object **)&local_60);
        bVar2 = iVar3 != 0;
        if (bVar2) {
          local_78 = ON_Curve::Cast((ON_Object *)local_60.m_min.x);
          if (local_78 == (ON_Curve *)0x0) {
            bVar2 = false;
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_polycurve.cpp"
                       ,0x1e1,"","ON_PolyCurve::Read() - non ON_Curve object in segment list\n");
            if ((ON_Object *)local_60.m_min.x != (ON_Object *)0x0) {
              (*(*(_func_int ***)local_60.m_min.x)[4])();
              bVar2 = false;
            }
          }
          else {
            ON_SimpleArray<ON_Curve_*>::Append
                      (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,&local_78);
            bVar2 = true;
          }
        }
      } while ((bVar2 != false) && (bVar1 = iVar5 < local_84[0], iVar5 = iVar5 + 1, bVar1));
    }
    this = local_70;
    if ((bVar2 != false) &&
       ((iVar5 = (local_70->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count,
        iVar5 == local_84[0] && 0 < iVar5 && ((local_70->m_t).m_count == local_84[0] + 1)))) {
      SanitizeDomain(local_70);
    }
  }
  if (bVar2 != false) {
    uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
    if (uVar4 < 0xbf065d0) {
      RemoveNesting(this);
    }
  }
  return bVar2;
}

Assistant:

bool ON_PolyCurve::Read(
       ON_BinaryArchive& file  // open binary file
     )
{
  // NOTE - if changed, check legacy I/O code
  Destroy();
  int major_version = 0;
  int minor_version = 0;
  
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  
  if (rc) 
  {
    ON_Object* obj;
    ON_Curve* crv;
    int segment_index;
    int segment_count = 0;
    int reserved1 = 0;
    int reserved2 = 0;
    rc = file.ReadInt(&segment_count);
    if (rc) rc = file.ReadInt(&reserved1);
    if (rc) rc = file.ReadInt(&reserved2);
    if (rc) {
      // may be set in future
      ON_BoundingBox bbox;
      rc = file.ReadBoundingBox(bbox);
    }
    if (rc) rc = file.ReadArray( m_t );

    for ( segment_index = 0; segment_index < segment_count && rc; segment_index++ ) {
      obj = 0;
      crv = 0;
      rc = file.ReadObject( &obj );
      if (rc) {
        crv = ON_Curve::Cast(obj);
        if (crv) {
          //Append(crv); - this one adds to m_t[]
          m_segment.Append(crv);
        }
        else {
          ON_ERROR("ON_PolyCurve::Read() - non ON_Curve object in segment list\n");
          delete obj;
          rc = false;
        }
      }
    }

    if ( rc && m_segment.Count()>0 && 
								m_segment.Count()==segment_count && m_t.Count()==segment_count+1)
    {
      // remove "fuzz" in m_t[] domain array that is in some older files.
      SanitizeDomain();
      /*
      double s, t, d0, d1, fuzz;
      ON_Interval in0, in1;
      in1 = SegmentCurve(0)->Domain();
      d1 = in1.Length();
      for ( segment_index = 1; segment_index < segment_count; segment_index++ )
      {
        t = m_t[segment_index];
        in0 = in1;
        d0 = d1;
        in1 = SegmentCurve(segment_index)->Domain();
        d1 = in1.Length();
        s = in0[1];
        if ( s != t && s == in1[0] && t > in0[0] && t < in1[1] )
        {
          fuzz = ((d0<=d1)?d0:d1)*ON_SQRT_EPSILON;
          if ( fabs(t-s) <= fuzz )
            m_t[segment_index] = s;
        }
      }
      fuzz = d1*ON_SQRT_EPSILON;
      t = m_t[segment_count];
      s = in1[1];
      if ( s != t && t > in1[0] && fabs(s-t) <= fuzz )
        m_t[segment_count] = s;
        */
    }
  }

  if (rc && file.ArchiveOpenNURBSVersion() < 200304080 )
  {
    // 8 April 2003 Dale Lear:
    //   Some archives written by earlier versions
    //   of Rhino had nested polycurves and polycurves with
    //   zero length segments.  This code cleans up
    //   those problems.  See RR 8932.
    RemoveNesting();
    //RemoveShortSegments(ON_ZERO_TOLERANCE);
  }

  return rc;
}